

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kp_space_time_stack.cpp
# Opt level: O2

void __thiscall KokkosTools::SpaceTimeStack::State::end_kernel(State *this,uint64_t kernid)

{
  Now end_time;
  ostream *poVar1;
  string local_30;
  
  end_time.impl.__d.__r = (Impl)std::chrono::_V2::system_clock::now();
  if (this->stack_frame == (StackNode *)kernid) {
    end_frame(this,end_time);
    return;
  }
  poVar1 = std::operator<<((ostream *)&std::cerr,"Expected \"");
  StackNode::get_full_name_abi_cxx11_(&local_30,this->stack_frame);
  poVar1 = std::operator<<(poVar1,(string *)&local_30);
  std::operator<<(poVar1,"\" to end, got different kernel ID\n");
  std::__cxx11::string::~string((string *)&local_30);
  abort();
}

Assistant:

void end_kernel(std::uint64_t kernid) {
    auto end_time    = now();
    auto expect_node = reinterpret_cast<StackNode*>(kernid);
    if (expect_node != stack_frame) {
      std::cerr << "Expected \"" << stack_frame->get_full_name()
                << "\" to end, got different kernel ID\n";
      abort();
    }
    end_frame(end_time);
  }